

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O2

int ptrstr(void)

{
  char animal [20];
  char local_38 [24];
  
  builtin_strncpy(local_38,"bear",5);
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  std::operator<<((ostream *)&std::cout,local_38);
}

Assistant:

int ptrstr () {
    using namespace std;
    char animal[20] = "bear";
    const char * bird = "wren";
    char * ps;

    cout << animal << " and " << bird << "\n";
    cout << *ps << endl; // uninitialized values
    cout << "input a kind of animal:";
    cin >> animal;
    ps = animal;
    cout << ps << "!\n";

    cout << "before using strcpy(): \n";
    cout << animal << " at " << (int *) animal << endl;
    cout << ps << " at " << (int *) ps << endl;

    //  new address
    ps = new char[strlen(animal) + 1];
    //  copy value to the newly created address
    strcpy(ps, animal);
    cout << "after using strcpy(): \n";
    cout << animal << " at " << (int *) animal << endl;
    cout << ps << " at " << (int *) ps << endl;
    delete [] ps;

    return 0;
}